

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_convert_db.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  unsigned_long uVar1;
  pointer __n;
  pointer __n_00;
  bool bVar2;
  uint uVar3;
  DatabaseInterface *pDVar4;
  pointer pDVar5;
  reference puVar6;
  allocator<unsigned_char> local_a1;
  undefined1 local_a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> blob;
  size_t blob_size;
  unsigned_long *hash;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  undefined1 local_58 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  size_t hash_count;
  uint local_30;
  ResourceTag tag;
  uint i;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  output_db;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  input_db;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  if (argc != 3) {
    print_help();
    return 1;
  }
  pDVar4 = Fossilize::create_database(argv[1],ReadOnly);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&output_db,pDVar4);
  pDVar4 = Fossilize::create_database(argv[2],OverWrite);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&i,pDVar4);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&output_db);
  if (bVar2) {
    pDVar5 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->(&output_db);
    uVar3 = (*pDVar5->_vptr_DatabaseInterface[2])();
    if ((uVar3 & 1) != 0) {
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&i);
      if (bVar2) {
        pDVar5 = std::
                 unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                               *)&i);
        uVar3 = (*pDVar5->_vptr_DatabaseInterface[2])();
        if ((uVar3 & 1) != 0) {
          for (local_30 = 0; local_30 < 10; local_30 = local_30 + 1) {
            hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pDVar5 = std::
                     unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ::operator->(&output_db);
            uVar3 = (*pDVar5->_vptr_DatabaseInterface[6])
                              (pDVar5,(ulong)local_30,
                               &hashes.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,0);
            __n_00 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            if ((uVar3 & 1) == 0) {
              argv_local._4_4_ = 1;
              break;
            }
            std::allocator<unsigned_long>::allocator
                      ((allocator<unsigned_long> *)((long)&__range2 + 7));
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,
                       (size_type)__n_00,(allocator_type *)((long)&__range2 + 7));
            std::allocator<unsigned_long>::~allocator
                      ((allocator<unsigned_long> *)((long)&__range2 + 7));
            pDVar5 = std::
                     unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ::operator->(&output_db);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
            uVar3 = (*pDVar5->_vptr_DatabaseInterface[6])
                              (pDVar5,(ulong)local_30,
                               &hashes.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
            if ((uVar3 & 1) == 0) {
              argv_local._4_4_ = 1;
              bVar2 = true;
            }
            else {
              __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58)
              ;
              hash = (unsigned_long *)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                 *)&hash), bVar2) {
                puVar6 = __gnu_cxx::
                         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator*(&__end2);
                blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                pDVar5 = std::
                         unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                         ::operator->(&output_db);
                uVar3 = (*pDVar5->_vptr_DatabaseInterface[3])
                                  (pDVar5,(ulong)local_30,*puVar6,
                                   &blob.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0);
                __n = blob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage;
                if ((uVar3 & 1) == 0) {
                  argv_local._4_4_ = 1;
                  bVar2 = true;
                  goto LAB_00105dbd;
                }
                std::allocator<unsigned_char>::allocator(&local_a1);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,
                           (size_type)__n,&local_a1);
                std::allocator<unsigned_char>::~allocator(&local_a1);
                pDVar5 = std::
                         unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                         ::operator->(&output_db);
                uVar1 = *puVar6;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
                uVar3 = (*pDVar5->_vptr_DatabaseInterface[3])(pDVar5,(ulong)local_30,uVar1);
                if ((uVar3 & 1) == 0) {
                  argv_local._4_4_ = 1;
                  bVar2 = true;
                }
                else {
                  pDVar5 = std::
                           unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                           ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                         *)&i);
                  uVar1 = *puVar6;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
                  uVar3 = (*pDVar5->_vptr_DatabaseInterface[4])(pDVar5,(ulong)local_30,uVar1);
                  if ((uVar3 & 1) == 0) {
                    argv_local._4_4_ = 1;
                    bVar2 = true;
                  }
                  else {
                    bVar2 = false;
                  }
                }
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
                if (bVar2) goto LAB_00105dbd;
                __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator++(&__end2);
              }
              bVar2 = false;
            }
LAB_00105dbd:
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58);
            if (bVar2) break;
          }
          goto LAB_00105de6;
        }
      }
      fprintf(_stderr,"Fossilize ERROR: Failed to open database for writing: %s\n",argv[2]);
      argv_local._4_4_ = 1;
      goto LAB_00105de6;
    }
  }
  fprintf(_stderr,"Fossilize ERROR: Failed to load database: %s\n",argv[1]);
  argv_local._4_4_ = 1;
LAB_00105de6:
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 *)&i);
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr(&output_db);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc != 3)
	{
		print_help();
		return EXIT_FAILURE;
	}

	auto input_db = std::unique_ptr<DatabaseInterface>(create_database(argv[1], DatabaseMode::ReadOnly));
	auto output_db = std::unique_ptr<DatabaseInterface>(create_database(argv[2], DatabaseMode::OverWrite));
	if (!input_db || !input_db->prepare())
	{
		LOGE("Failed to load database: %s\n", argv[1]);
		return EXIT_FAILURE;
	}

	if (!output_db || !output_db->prepare())
	{
		LOGE("Failed to open database for writing: %s\n", argv[2]);
		return EXIT_FAILURE;
	}

	for (unsigned i = 0; i < RESOURCE_COUNT; i++)
	{
		auto tag = static_cast<ResourceTag>(i);

		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
			return EXIT_FAILURE;
		std::vector<Hash> hashes(hash_count);
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
			return EXIT_FAILURE;

		for (auto &hash : hashes)
		{
			size_t blob_size = 0;
			if (!input_db->read_entry(tag, hash, &blob_size, nullptr, PAYLOAD_READ_NO_FLAGS))
				return EXIT_FAILURE;
			std::vector<uint8_t> blob(blob_size);
			if (!input_db->read_entry(tag, hash, &blob_size, blob.data(), PAYLOAD_READ_NO_FLAGS))
				return EXIT_FAILURE;

			if (!output_db->write_entry(tag, hash, blob.data(), blob.size(),
					PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT |
					PAYLOAD_WRITE_COMPRESS_BIT |
					PAYLOAD_WRITE_BEST_COMPRESSION_BIT))
			{
				return EXIT_FAILURE;
			}
		}
	}
}